

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

int dmrC_inline_function(dmr_C *C,expression *expr,symbol *sym)

{
  symbol *psVar1;
  statement *decl;
  symbol *a;
  ptr_list_iter argiter__;
  ptr_list_iter nameiter__;
  expression *arg;
  symbol *name;
  symbol_list *arg_decl;
  symbol_list *name_list;
  statement *stmt;
  expression_list *arg_list;
  symbol *fn;
  symbol_list *fn_symbol_list;
  symbol *sym_local;
  expression *expr_local;
  dmr_C *C_local;
  
  arg_list = (expression_list *)(sym->field_14).field_2.ctype.base_type;
  stmt = (statement *)(expr->field_5).field_2.string;
  fn_symbol_list = (symbol_list *)sym;
  sym_local = (symbol *)expr;
  expr_local = (expression *)C;
  name_list = (symbol_list *)dmrC_alloc_statement(C,expr->pos,3);
  if (arg_list->list_[0x10] == (expression *)0x0) {
    dmrC_sparse_error((dmr_C *)expr_local,*(position *)&arg_list->field_0x4,
                      "marked inline, but without a definition");
    C_local._4_4_ = 0;
  }
  else if ((*(uint *)((long)arg_list->list_ + 0x34) >> 0x15 & 1) == 0) {
    *(uint *)((long)arg_list->list_ + 0x34) =
         *(uint *)((long)arg_list->list_ + 0x34) & 0xffdfffff | 0x200000;
    arg_decl = (symbol_list *)arg_list->list_[0xd];
    *(ushort *)sym_local = *(ushort *)sym_local & 0xff00 | 0x13;
    sym_local->next_id = (symbol *)name_list;
    *(expression **)&(sym_local->endpos).field_0x4 = arg_list->list_[0xc];
    fn = (symbol *)
         create_symbol_list((dmr_C *)expr_local,(symbol_list *)fn_symbol_list->list_[0x11]);
    name = (symbol *)0x0;
    ptrlist_forward_iterator((ptr_list_iter *)&argiter__.__nr,(ptr_list *)arg_decl);
    arg = (expression *)ptrlist_iter_next((ptr_list_iter *)&argiter__.__nr);
    ptrlist_forward_iterator((ptr_list_iter *)&a,(ptr_list *)stmt);
    nameiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&a);
    while (nameiter__._16_8_ != 0) {
      psVar1 = dmrC_alloc_symbol((global_symbols_t *)expr_local->pos,
                                 *(position *)(nameiter__._16_8_ + 8),3);
      (psVar1->field_14).field_2.ctype.base_type = *(symbol **)(nameiter__._16_8_ + 0x10);
      if (arg != (expression *)0x0) {
        memcpy(psVar1,arg,0xe8);
        set_replace((symbol *)arg,psVar1);
        dmrC_add_symbol((dmr_C *)expr_local,(symbol_list **)&fn,psVar1);
      }
      (psVar1->field_14).field_2.initializer = (expression *)nameiter__._16_8_;
      dmrC_add_symbol((dmr_C *)expr_local,(symbol_list **)&name,psVar1);
      arg = (expression *)ptrlist_iter_next((ptr_list_iter *)&argiter__.__nr);
      nameiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&a);
    }
    dmrC_copy_statement((dmr_C *)expr_local,(statement *)arg_list->list_[0x10],
                        (statement *)name_list);
    if (name != (symbol *)0x0) {
      psVar1 = (symbol *)
               dmrC_alloc_statement((dmr_C *)expr_local,*(position *)&(sym_local->pos).field_0x4,1);
      (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(psVar1->endpos).field_0x4)->field_5).
      label_identifier = name;
      name_list->list_[1] = psVar1;
    }
    name_list->list_[0] = (symbol *)fn_symbol_list;
    unset_replace_list((dmr_C *)expr_local,(symbol_list *)fn);
    dmrC_evaluate_statement((dmr_C *)expr_local,(statement *)name_list);
    *(uint *)((long)arg_list->list_ + 0x34) = *(uint *)((long)arg_list->list_ + 0x34) & 0xffdfffff;
    C_local._4_4_ = 1;
  }
  else {
    C_local._4_4_ = 0;
  }
  return C_local._4_4_;
}

Assistant:

int dmrC_inline_function(struct dmr_C *C, struct expression *expr, struct symbol *sym)
{
	struct symbol_list * fn_symbol_list;
	struct symbol *fn = sym->ctype.base_type;
	struct expression_list *arg_list = expr->args;
	struct statement *stmt = dmrC_alloc_statement(C, expr->pos, STMT_COMPOUND);
	struct symbol_list *name_list, *arg_decl;
	struct symbol *name;
	struct expression *arg;

	if (!fn->inline_stmt) {
		dmrC_sparse_error(C, fn->pos, "marked inline, but without a definition");
		return 0;
	}
	if (fn->expanding)
		return 0;

	fn->expanding = 1;

	name_list = fn->arguments;

	expr->type = EXPR_STATEMENT;
	expr->statement = stmt;
	expr->ctype = fn->ctype.base_type;

	fn_symbol_list = create_symbol_list(C, sym->inline_symbol_list);

	arg_decl = NULL;
	PREPARE_PTR_LIST(name_list, name);
	FOR_EACH_PTR(arg_list, arg) {
		struct symbol *a = dmrC_alloc_symbol(C->S, arg->pos, SYM_NODE);

		a->ctype.base_type = arg->ctype;
		if (name) {
			*a = *name;
			set_replace(name, a);
			dmrC_add_symbol(C, &fn_symbol_list, a);
		}
		a->initializer = arg;
		dmrC_add_symbol(C, &arg_decl, a);

		NEXT_PTR_LIST(name);
	} END_FOR_EACH_PTR(arg);
	FINISH_PTR_LIST(name);

	dmrC_copy_statement(C, fn->inline_stmt, stmt);

	if (arg_decl) {
		struct statement *decl = dmrC_alloc_statement(C, expr->pos, STMT_DECLARATION);
		decl->declaration = arg_decl;
		stmt->args = decl;
	}
	stmt->inline_fn = sym;

	unset_replace_list(C, fn_symbol_list);

	dmrC_evaluate_statement(C, stmt);

	fn->expanding = 0;
	return 1;
}